

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

double __thiscall soplex::SoPlexBase<double>::objValueReal(SoPlexBase<double> *this)

{
  double dVar1;
  
  if (this->_status == INFEASIBLE) {
    dVar1 = (double)this->_currentSettings->_intParamValues[0] *
            -this->_currentSettings->_realParamValues[6];
  }
  else if (this->_status == UNBOUNDED) {
    dVar1 = (double)this->_currentSettings->_intParamValues[0] *
            this->_currentSettings->_realParamValues[6];
  }
  else {
    dVar1 = 0.0;
    if (((this->_hasSolReal | this->_hasSolRational) & 1U) != 0) {
      if (((this->_hasSolReal | ~this->_hasSolRational) & 1U) == 0) {
        SolBase<double>::operator=(&this->_solReal,&this->_solRational);
        this->_hasSolReal = true;
      }
      dVar1 = (this->_solReal)._objVal;
    }
  }
  return dVar1;
}

Assistant:

R SoPlexBase<R>::objValueReal()
{
   assert(OBJSENSE_MAXIMIZE == 1);
   assert(OBJSENSE_MINIMIZE == -1);

   if(status() == SPxSolverBase<R>::UNBOUNDED)
      return realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(status() == SPxSolverBase<R>::INFEASIBLE)
      return -realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(hasSol())
   {
      _syncRealSolution();
      return _solReal._objVal;
   }
   else
      return 0.0;
}